

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O0

void Nwk_ManCollectOverlapCands(Nwk_Obj_t *pLut,Vec_Ptr_t *vCands,Nwk_LMPars_t *pPars)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int local_38;
  int local_34;
  int k;
  int i;
  Nwk_Obj_t *pObj;
  Nwk_Obj_t *pFanin;
  Nwk_LMPars_t *pPars_local;
  Vec_Ptr_t *vCands_local;
  Nwk_Obj_t *pLut_local;
  
  local_34 = 0;
  while( true ) {
    bVar3 = false;
    if (local_34 < pLut->nFanins) {
      pObj = pLut->pFanio[local_34];
      bVar3 = pObj != (Nwk_Obj_t *)0x0;
    }
    if (!bVar3) break;
    *(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 & 0xffffffbf | 0x40;
    local_34 = local_34 + 1;
  }
  Vec_PtrClear(vCands);
  Nwk_ManIncrementTravId(pLut->pMan);
  Nwk_ObjSetTravIdCurrent(pLut);
  local_34 = 0;
  while( true ) {
    bVar3 = false;
    if (local_34 < pLut->nFanins) {
      pObj = pLut->pFanio[local_34];
      bVar3 = pObj != (Nwk_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Nwk_ObjIsNode(pObj);
    if ((iVar1 != 0) && (iVar1 = Nwk_ObjFanoutNum(pObj), iVar1 <= pPars->nMaxFanout)) {
      local_38 = 0;
      while( true ) {
        bVar3 = false;
        if (local_38 < pObj->nFanouts) {
          _k = pObj->pFanio[pObj->nFanins + local_38];
          bVar3 = _k != (Nwk_Obj_t *)0x0;
        }
        if (!bVar3) break;
        iVar1 = Nwk_ObjIsNode(_k);
        if ((iVar1 != 0) && (iVar1 = Nwk_ObjIsTravIdCurrent(_k), iVar1 == 0)) {
          Nwk_ObjSetTravIdCurrent(_k);
          iVar1 = Nwk_ObjLevel(pLut);
          iVar2 = Nwk_ObjLevel(_k);
          if (iVar1 - iVar2 <= pPars->nMaxLevelDiff) {
            iVar1 = Nwk_ObjLevel(_k);
            iVar2 = Nwk_ObjLevel(pLut);
            if ((iVar1 - iVar2 <= pPars->nMaxLevelDiff) &&
               (iVar1 = Nwk_ManCountTotalFanins(pLut,_k), iVar1 <= pPars->nMaxSuppSize)) {
              Vec_PtrPush(vCands,_k);
            }
          }
        }
        local_38 = local_38 + 1;
      }
    }
    local_34 = local_34 + 1;
  }
  local_34 = 0;
  while( true ) {
    bVar3 = false;
    if (local_34 < pLut->nFanins) {
      pObj = pLut->pFanio[local_34];
      bVar3 = pObj != (Nwk_Obj_t *)0x0;
    }
    if (!bVar3) break;
    *(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 & 0xffffffbf;
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

void Nwk_ManCollectOverlapCands( Nwk_Obj_t * pLut, Vec_Ptr_t * vCands, Nwk_LMPars_t * pPars )
{
    Nwk_Obj_t * pFanin, * pObj;
    int i, k;
    // mark fanins of pLut
    Nwk_ObjForEachFanin( pLut, pFanin, i )
        pFanin->MarkC = 1;
    // collect the matching fanouts of each fanin of the node
    Vec_PtrClear( vCands );
    Nwk_ManIncrementTravId( pLut->pMan );
    Nwk_ObjSetTravIdCurrent( pLut );
    Nwk_ObjForEachFanin( pLut, pFanin, i )
    {
        if ( !Nwk_ObjIsNode(pFanin) )
            continue;
        if ( Nwk_ObjFanoutNum(pFanin) > pPars->nMaxFanout )
            continue;
        Nwk_ObjForEachFanout( pFanin, pObj, k )
        {
            if ( !Nwk_ObjIsNode(pObj) )
                continue;
            if ( Nwk_ObjIsTravIdCurrent( pObj ) )
                continue;
            Nwk_ObjSetTravIdCurrent( pObj );
            // check the difference in delay
            if ( Nwk_ObjLevel(pLut) - Nwk_ObjLevel(pObj) > pPars->nMaxLevelDiff || 
                 Nwk_ObjLevel(pObj) - Nwk_ObjLevel(pLut) > pPars->nMaxLevelDiff )
                 continue;
            // check the total number of fanins of the node
            if ( Nwk_ManCountTotalFanins(pLut, pObj) > pPars->nMaxSuppSize )
                continue;
            Vec_PtrPush( vCands, pObj );
        }
    }
    // unmark fanins of pLut
    Nwk_ObjForEachFanin( pLut, pFanin, i )
        pFanin->MarkC = 0;
}